

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

bool __thiscall
re2::RE2::Match(RE2 *this,StringPiece *text,size_t startpos,size_t endpos,Anchor re_anchor,
               StringPiece *submatch,int nsubmatch)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  size_type sVar5;
  ulong uVar6;
  char *a;
  const_pointer pcVar7;
  void *__s1;
  ulong in_RCX;
  ulong in_RDX;
  StringPiece *in_RSI;
  RE2 *in_RDI;
  int in_R8D;
  StringPiece *in_R9;
  int in_stack_00000008;
  int i;
  StringPiece subtext1;
  Prog *prog;
  bool dfa_failed;
  size_t bit_state_text_max;
  bool can_bit_state;
  int kMaxBitStateBitmapSize;
  bool can_one_pass;
  bool skipped_test;
  MatchKind kind;
  Anchor anchor;
  size_t prefixlen;
  int ncap;
  StringPiece *matchp;
  StringPiece match;
  StringPiece subtext;
  LogMessage *in_stack_ffffffffffffef90;
  LogMessage *pLVar8;
  undefined8 in_stack_ffffffffffffefb0;
  int line;
  char *in_stack_ffffffffffffefb8;
  undefined4 in_stack_ffffffffffffefc0;
  int in_stack_ffffffffffffefc4;
  StringPiece *in_stack_fffffffffffff038;
  undefined8 in_stack_fffffffffffff040;
  StringPiece *in_stack_fffffffffffff048;
  MatchKind in_stack_fffffffffffff050;
  Anchor in_stack_fffffffffffff054;
  Prog *in_stack_fffffffffffff058;
  StringPiece *in_stack_fffffffffffff060;
  Prog *in_stack_fffffffffffff068;
  undefined4 in_stack_fffffffffffff070;
  int in_stack_fffffffffffff074;
  Prog *in_stack_fffffffffffff078;
  int in_stack_fffffffffffff080;
  int in_stack_fffffffffffff090;
  bool local_f09;
  StringPiece local_e68;
  int local_e54;
  StringPiece local_e50 [12];
  StringPiece *in_stack_fffffffffffff278;
  MatchKind in_stack_fffffffffffff280;
  Anchor in_stack_fffffffffffff284;
  StringPiece *in_stack_fffffffffffff288;
  StringPiece *in_stack_fffffffffffff290;
  Prog *in_stack_fffffffffffff298;
  int in_stack_fffffffffffff2b0;
  LogMessage local_cc0;
  LogMessage local_b40;
  StringPiece local_9c0;
  LogMessage local_9b0;
  LogMessage local_830;
  LogMessage local_6b0;
  Prog *local_530;
  LogMessage local_528;
  byte local_3a1;
  ulong local_3a0;
  byte local_391;
  undefined4 local_390;
  bool local_38a;
  byte local_389;
  undefined4 local_388;
  int local_384;
  size_type local_380;
  int local_374;
  StringPiece *local_370;
  StringPiece local_368;
  StringPiece local_358;
  LogMessage local_348;
  LogMessage local_1b8;
  StringPiece *local_38;
  int local_2c;
  ulong local_28;
  ulong local_20;
  StringPiece *local_18;
  bool local_1;
  
  line = (int)((ulong)in_stack_ffffffffffffefb0 >> 0x20);
  local_38 = in_R9;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar2 = ok((RE2 *)0x2032f3);
  uVar6 = local_28;
  if (bVar2) {
    if ((local_28 < local_20) || (sVar5 = StringPiece::size(local_18), sVar5 < uVar6)) {
      bVar2 = Options::log_errors(&in_RDI->options_);
      if (bVar2) {
        LogMessage::LogMessage
                  ((LogMessage *)CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),
                   in_stack_ffffffffffffefb8,line);
        poVar4 = LogMessage::stream(&local_348);
        poVar4 = std::operator<<(poVar4,"RE2: invalid startpos, endpos pair. [");
        poVar4 = std::operator<<(poVar4,"startpos: ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_20);
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = std::operator<<(poVar4,"endpos: ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_28);
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = std::operator<<(poVar4,"text size: ");
        sVar5 = StringPiece::size(local_18);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
        std::operator<<(poVar4,"]");
        LogMessage::~LogMessage(in_stack_ffffffffffffef90);
      }
      local_1 = false;
    }
    else {
      local_358.data_ = local_18->data_;
      local_358.size_ = local_18->size_;
      StringPiece::remove_prefix(&local_358,local_20);
      sVar5 = StringPiece::size(local_18);
      StringPiece::remove_suffix(&local_358,sVar5 - local_28);
      StringPiece::StringPiece(&local_368);
      local_370 = &local_368;
      if (in_stack_00000008 == 0) {
        local_370 = (StringPiece *)0x0;
      }
      local_374 = NumberOfCapturingGroups(in_RDI);
      local_374 = local_374 + 1;
      if (in_stack_00000008 < local_374) {
        local_374 = in_stack_00000008;
      }
      bVar2 = Prog::anchor_start(in_RDI->prog_);
      if ((bVar2) && (local_20 != 0)) {
        local_1 = false;
      }
      else {
        bVar2 = Prog::anchor_start(in_RDI->prog_);
        if ((bVar2) && (bVar2 = Prog::anchor_end(in_RDI->prog_), bVar2)) {
          local_2c = 2;
        }
        else {
          bVar2 = Prog::anchor_start(in_RDI->prog_);
          if ((bVar2) && (local_2c != 2)) {
            local_2c = 1;
          }
        }
        local_380 = 0;
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          if (local_20 != 0) {
            return false;
          }
          uVar6 = std::__cxx11::string::size();
          local_380 = uVar6;
          sVar5 = StringPiece::size(&local_358);
          if (sVar5 < uVar6) {
            return false;
          }
          if ((in_RDI->prefix_foldcase_ & 1U) == 0) {
            __s1 = (void *)std::__cxx11::string::operator[]((ulong)&in_RDI->prefix_);
            pcVar7 = StringPiece::data(&local_358);
            iVar3 = memcmp(__s1,pcVar7,local_380);
            if (iVar3 != 0) {
              return false;
            }
          }
          else {
            a = (char *)std::__cxx11::string::operator[]((ulong)&in_RDI->prefix_);
            pcVar7 = StringPiece::data(&local_358);
            iVar3 = ascii_strcasecmp(a,pcVar7,local_380);
            if (iVar3 != 0) {
              return false;
            }
          }
          StringPiece::remove_prefix(&local_358,local_380);
          if (local_2c != 2) {
            local_2c = 1;
          }
        }
        local_384 = 0;
        local_388 = 0;
        bVar2 = Options::longest_match(&in_RDI->options_);
        if (bVar2) {
          local_388 = 1;
        }
        local_389 = 0;
        local_f09 = (in_RDI->is_one_pass_ & 1U) != 0 && local_374 < 6;
        local_38a = local_f09;
        local_390 = 0x40000;
        local_391 = Prog::CanBitState((Prog *)0x203945);
        iVar3 = Prog::list_count(in_RDI->prog_);
        local_3a0 = (ulong)(int)(0x40000 / (long)iVar3);
        local_3a1 = 0;
        if ((local_2c == 0) || (1 < local_2c - 1U)) {
          bVar2 = Prog::SearchDFA(in_stack_fffffffffffff058,
                                  (StringPiece *)
                                  CONCAT44(in_stack_fffffffffffff054,in_stack_fffffffffffff050),
                                  in_stack_fffffffffffff048,
                                  (Anchor)((ulong)in_stack_fffffffffffff040 >> 0x20),
                                  (MatchKind)in_stack_fffffffffffff040,in_stack_fffffffffffff038,
                                  (bool *)CONCAT44(in_stack_fffffffffffff074,
                                                   in_stack_fffffffffffff070),
                                  (SparseSet *)in_stack_fffffffffffff078);
          if (bVar2) {
            if (local_370 == (StringPiece *)0x0) {
              return true;
            }
            local_530 = ReverseProg((RE2 *)in_stack_ffffffffffffef90);
            if (local_530 == (Prog *)0x0) {
              return false;
            }
            bVar2 = Prog::SearchDFA(in_stack_fffffffffffff058,
                                    (StringPiece *)
                                    CONCAT44(in_stack_fffffffffffff054,in_stack_fffffffffffff050),
                                    in_stack_fffffffffffff048,
                                    (Anchor)((ulong)in_stack_fffffffffffff040 >> 0x20),
                                    (MatchKind)in_stack_fffffffffffff040,in_stack_fffffffffffff038,
                                    (bool *)CONCAT44(in_stack_fffffffffffff074,
                                                     in_stack_fffffffffffff070),
                                    (SparseSet *)in_stack_fffffffffffff078);
            if (!bVar2) {
              if ((local_3a1 & 1) == 0) {
                bVar2 = Options::log_errors(&in_RDI->options_);
                if (bVar2) {
                  LogMessage::LogMessage
                            ((LogMessage *)
                             CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),
                             in_stack_ffffffffffffefb8,line);
                  poVar4 = LogMessage::stream(&local_830);
                  std::operator<<(poVar4,"SearchDFA inconsistency");
                  LogMessage::~LogMessage(in_stack_ffffffffffffef90);
                }
                return false;
              }
              bVar2 = Options::log_errors(&in_RDI->options_);
              if (bVar2) {
                pLVar8 = &local_6b0;
                LogMessage::LogMessage
                          ((LogMessage *)
                           CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),
                           in_stack_ffffffffffffefb8,line);
                poVar4 = LogMessage::stream(pLVar8);
                in_stack_fffffffffffff080 = (int)pLVar8;
                in_stack_fffffffffffff078 =
                     (Prog *)std::operator<<(poVar4,"DFA out of memory: size ");
                in_stack_fffffffffffff074 = Prog::size(local_530);
                in_stack_fffffffffffff068 =
                     (Prog *)std::ostream::operator<<
                                       (in_stack_fffffffffffff078,in_stack_fffffffffffff074);
                in_stack_fffffffffffff060 =
                     (StringPiece *)std::operator<<((ostream *)in_stack_fffffffffffff068,", ");
                in_stack_fffffffffffff058 =
                     (Prog *)std::operator<<((ostream *)in_stack_fffffffffffff060,"bytemap range ");
                in_stack_fffffffffffff054 = Prog::bytemap_range(local_530);
                in_stack_fffffffffffff048 =
                     (StringPiece *)
                     std::ostream::operator<<(in_stack_fffffffffffff058,in_stack_fffffffffffff054);
                poVar4 = std::operator<<((ostream *)in_stack_fffffffffffff048,", ");
                poVar4 = std::operator<<(poVar4,"list count ");
                iVar3 = Prog::list_count(local_530);
                std::ostream::operator<<(poVar4,iVar3);
                LogMessage::~LogMessage(in_stack_ffffffffffffef90);
              }
              local_389 = 1;
            }
          }
          else {
            if ((local_3a1 & 1) == 0) {
              return false;
            }
            bVar2 = Options::log_errors(&in_RDI->options_);
            if (bVar2) {
              LogMessage::LogMessage
                        ((LogMessage *)CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0)
                         ,in_stack_ffffffffffffefb8,line);
              poVar4 = LogMessage::stream(&local_528);
              poVar4 = std::operator<<(poVar4,"DFA out of memory: size ");
              iVar3 = Prog::size(in_RDI->prog_);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
              poVar4 = std::operator<<(poVar4,", ");
              poVar4 = std::operator<<(poVar4,"bytemap range ");
              iVar3 = Prog::bytemap_range(in_RDI->prog_);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
              poVar4 = std::operator<<(poVar4,", ");
              poVar4 = std::operator<<(poVar4,"list count ");
              iVar3 = Prog::list_count(in_RDI->prog_);
              std::ostream::operator<<(poVar4,iVar3);
              LogMessage::~LogMessage(in_stack_ffffffffffffef90);
            }
            local_389 = 1;
          }
        }
        else {
          if (local_2c == 2) {
            local_388 = 2;
          }
          local_384 = 1;
          if ((((local_38a & 1U) == 0) || (sVar5 = StringPiece::size(local_18), 0x1000 < sVar5)) ||
             ((local_374 < 2 && (sVar5 = StringPiece::size(local_18), 8 < sVar5)))) {
            if ((((local_391 & 1) == 0) || (sVar5 = StringPiece::size(local_18), local_3a0 < sVar5))
               || (local_374 < 2)) {
              bVar2 = Prog::SearchDFA(in_stack_fffffffffffff058,
                                      (StringPiece *)
                                      CONCAT44(in_stack_fffffffffffff054,in_stack_fffffffffffff050),
                                      in_stack_fffffffffffff048,
                                      (Anchor)((ulong)in_stack_fffffffffffff040 >> 0x20),
                                      (MatchKind)in_stack_fffffffffffff040,in_stack_fffffffffffff038
                                      ,(bool *)CONCAT44(in_stack_fffffffffffff074,
                                                        in_stack_fffffffffffff070),
                                      (SparseSet *)in_stack_fffffffffffff078);
              if (!bVar2) {
                if ((local_3a1 & 1) == 0) {
                  return false;
                }
                bVar2 = Options::log_errors(&in_RDI->options_);
                if (bVar2) {
                  LogMessage::LogMessage
                            ((LogMessage *)
                             CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),
                             in_stack_ffffffffffffefb8,line);
                  poVar4 = LogMessage::stream(&local_9b0);
                  poVar4 = std::operator<<(poVar4,"DFA out of memory: size ");
                  iVar3 = Prog::size(in_RDI->prog_);
                  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
                  poVar4 = std::operator<<(poVar4,", ");
                  poVar4 = std::operator<<(poVar4,"bytemap range ");
                  iVar3 = Prog::bytemap_range(in_RDI->prog_);
                  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
                  poVar4 = std::operator<<(poVar4,", ");
                  poVar4 = std::operator<<(poVar4,"list count ");
                  in_stack_ffffffffffffefc4 = Prog::list_count(in_RDI->prog_);
                  std::ostream::operator<<(poVar4,in_stack_ffffffffffffefc4);
                  LogMessage::~LogMessage(in_stack_ffffffffffffef90);
                }
                local_389 = 1;
              }
            }
            else {
              local_389 = 1;
            }
          }
          else {
            local_389 = 1;
          }
        }
        if (((local_389 & 1) == 0) && (local_374 < 2)) {
          if (local_374 == 1) {
            local_38->data_ = local_368.data_;
            local_38->size_ = local_368.size_;
          }
        }
        else {
          StringPiece::StringPiece(&local_9c0);
          if ((local_389 & 1) == 0) {
            local_9c0.data_ = local_368.data_;
            local_9c0.size_ = local_368.size_;
            local_384 = 1;
            local_388 = 2;
          }
          else {
            local_9c0.data_ = local_358.data_;
            local_9c0.size_ = local_358.size_;
          }
          if (((local_38a & 1U) == 0) || (local_384 == 0)) {
            if (((local_391 & 1) == 0) || (sVar5 = StringPiece::size(&local_9c0), local_3a0 < sVar5)
               ) {
              bVar2 = Prog::SearchNFA(in_stack_fffffffffffff078,
                                      (StringPiece *)
                                      CONCAT44(in_stack_fffffffffffff074,in_stack_fffffffffffff070),
                                      (StringPiece *)in_stack_fffffffffffff068,
                                      (Anchor)((ulong)in_stack_fffffffffffff060 >> 0x20),
                                      (MatchKind)in_stack_fffffffffffff060,
                                      (StringPiece *)in_stack_fffffffffffff058,
                                      in_stack_fffffffffffff090);
              if (!bVar2) {
                if (((local_389 & 1) == 0) &&
                   (bVar2 = Options::log_errors(&in_RDI->options_), bVar2)) {
                  pLVar8 = (LogMessage *)(local_e50 + 1);
                  LogMessage::LogMessage
                            ((LogMessage *)
                             CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),
                             in_stack_ffffffffffffefb8,line);
                  poVar4 = LogMessage::stream(pLVar8);
                  std::operator<<(poVar4,"SearchNFA inconsistency");
                  LogMessage::~LogMessage(pLVar8);
                }
                return false;
              }
            }
            else {
              bVar2 = Prog::SearchBitState
                                (in_stack_fffffffffffff068,in_stack_fffffffffffff060,
                                 (StringPiece *)in_stack_fffffffffffff058,in_stack_fffffffffffff054,
                                 in_stack_fffffffffffff050,in_stack_fffffffffffff048,
                                 in_stack_fffffffffffff080);
              if (!bVar2) {
                if (((local_389 & 1) == 0) &&
                   (bVar2 = Options::log_errors(&in_RDI->options_), bVar2)) {
                  LogMessage::LogMessage
                            ((LogMessage *)
                             CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),
                             in_stack_ffffffffffffefb8,line);
                  poVar4 = LogMessage::stream(&local_cc0);
                  std::operator<<(poVar4,"SearchBitState inconsistency");
                  LogMessage::~LogMessage(in_stack_ffffffffffffef90);
                }
                return false;
              }
            }
          }
          else {
            bVar2 = Prog::SearchOnePass(in_stack_fffffffffffff298,in_stack_fffffffffffff290,
                                        in_stack_fffffffffffff288,in_stack_fffffffffffff284,
                                        in_stack_fffffffffffff280,in_stack_fffffffffffff278,
                                        in_stack_fffffffffffff2b0);
            if (!bVar2) {
              if (((local_389 & 1) == 0) && (bVar2 = Options::log_errors(&in_RDI->options_), bVar2))
              {
                pLVar8 = &local_b40;
                LogMessage::LogMessage
                          ((LogMessage *)
                           CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),
                           in_stack_ffffffffffffefb8,(int)((ulong)pLVar8 >> 0x20));
                poVar4 = LogMessage::stream(pLVar8);
                std::operator<<(poVar4,"SearchOnePass inconsistency");
                LogMessage::~LogMessage(in_stack_ffffffffffffef90);
              }
              return false;
            }
          }
        }
        if ((local_380 != 0) && (0 < in_stack_00000008)) {
          pcVar7 = StringPiece::data(local_38);
          lVar1 = -local_380;
          sVar5 = StringPiece::size(local_38);
          StringPiece::StringPiece(local_e50,pcVar7 + lVar1,sVar5 + local_380);
          local_38->data_ = local_e50[0].data_;
          local_38->size_ = local_e50[0].size_;
        }
        for (local_e54 = local_374; local_e54 < in_stack_00000008; local_e54 = local_e54 + 1) {
          StringPiece::StringPiece(&local_e68);
          local_38[local_e54].data_ = local_e68.data_;
          local_38[local_e54].size_ = local_e68.size_;
        }
        local_1 = true;
      }
    }
  }
  else {
    bVar2 = Options::log_errors(&in_RDI->options_);
    if (bVar2) {
      LogMessage::LogMessage
                ((LogMessage *)CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),
                 in_stack_ffffffffffffefb8,line);
      poVar4 = LogMessage::stream(&local_1b8);
      poVar4 = std::operator<<(poVar4,"Invalid RE2: ");
      std::operator<<(poVar4,(string *)in_RDI->error_);
      LogMessage::~LogMessage(in_stack_ffffffffffffef90);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool RE2::Match(const StringPiece& text,
                size_t startpos,
                size_t endpos,
                Anchor re_anchor,
                StringPiece* submatch,
                int nsubmatch) const {
  if (!ok()) {
    if (options_.log_errors())
      LOG(ERROR) << "Invalid RE2: " << *error_;
    return false;
  }

  if (startpos > endpos || endpos > text.size()) {
    if (options_.log_errors())
      LOG(ERROR) << "RE2: invalid startpos, endpos pair. ["
                 << "startpos: " << startpos << ", "
                 << "endpos: " << endpos << ", "
                 << "text size: " << text.size() << "]";
    return false;
  }

  StringPiece subtext = text;
  subtext.remove_prefix(startpos);
  subtext.remove_suffix(text.size() - endpos);

  // Use DFAs to find exact location of match, filter out non-matches.

  // Don't ask for the location if we won't use it.
  // SearchDFA can do extra optimizations in that case.
  StringPiece match;
  StringPiece* matchp = &match;
  if (nsubmatch == 0)
    matchp = NULL;

  int ncap = 1 + NumberOfCapturingGroups();
  if (ncap > nsubmatch)
    ncap = nsubmatch;

  // If the regexp is anchored explicitly, must not be in middle of text.
  if (prog_->anchor_start() && startpos != 0)
    return false;

  // If the regexp is anchored explicitly, update re_anchor
  // so that we can potentially fall into a faster case below.
  if (prog_->anchor_start() && prog_->anchor_end())
    re_anchor = ANCHOR_BOTH;
  else if (prog_->anchor_start() && re_anchor != ANCHOR_BOTH)
    re_anchor = ANCHOR_START;

  // Check for the required prefix, if any.
  size_t prefixlen = 0;
  if (!prefix_.empty()) {
    if (startpos != 0)
      return false;
    prefixlen = prefix_.size();
    if (prefixlen > subtext.size())
      return false;
    if (prefix_foldcase_) {
      if (ascii_strcasecmp(&prefix_[0], subtext.data(), prefixlen) != 0)
        return false;
    } else {
      if (memcmp(&prefix_[0], subtext.data(), prefixlen) != 0)
        return false;
    }
    subtext.remove_prefix(prefixlen);
    // If there is a required prefix, the anchor must be at least ANCHOR_START.
    if (re_anchor != ANCHOR_BOTH)
      re_anchor = ANCHOR_START;
  }

  Prog::Anchor anchor = Prog::kUnanchored;
  Prog::MatchKind kind = Prog::kFirstMatch;
  if (options_.longest_match())
    kind = Prog::kLongestMatch;
  bool skipped_test = false;

  bool can_one_pass = (is_one_pass_ && ncap <= Prog::kMaxOnePassCapture);

  // BitState allocates a bitmap of size prog_->list_count() * text.size().
  // It also allocates a stack of 3-word structures which could potentially
  // grow as large as prog_->list_count() * text.size(), but in practice is
  // much smaller.
  const int kMaxBitStateBitmapSize = 256*1024;  // bitmap size <= max (bits)
  bool can_bit_state = prog_->CanBitState();
  size_t bit_state_text_max = kMaxBitStateBitmapSize / prog_->list_count();

  bool dfa_failed = false;
  switch (re_anchor) {
    default:
    case UNANCHORED: {
      if (!prog_->SearchDFA(subtext, text, anchor, kind,
                            matchp, &dfa_failed, NULL)) {
        if (dfa_failed) {
          if (options_.log_errors())
            LOG(ERROR) << "DFA out of memory: size " << prog_->size() << ", "
                       << "bytemap range " << prog_->bytemap_range() << ", "
                       << "list count " << prog_->list_count();
          // Fall back to NFA below.
          skipped_test = true;
          break;
        }
        return false;
      }
      if (matchp == NULL)  // Matched.  Don't care where
        return true;
      // SearchDFA set match[0].end() but didn't know where the
      // match started.  Run the regexp backward from match[0].end()
      // to find the longest possible match -- that's where it started.
      Prog* prog = ReverseProg();
      if (prog == NULL)
        return false;
      if (!prog->SearchDFA(match, text, Prog::kAnchored,
                           Prog::kLongestMatch, &match, &dfa_failed, NULL)) {
        if (dfa_failed) {
          if (options_.log_errors())
            LOG(ERROR) << "DFA out of memory: size " << prog->size() << ", "
                       << "bytemap range " << prog->bytemap_range() << ", "
                       << "list count " << prog->list_count();
          // Fall back to NFA below.
          skipped_test = true;
          break;
        }
        if (options_.log_errors())
          LOG(ERROR) << "SearchDFA inconsistency";
        return false;
      }
      break;
    }

    case ANCHOR_BOTH:
    case ANCHOR_START:
      if (re_anchor == ANCHOR_BOTH)
        kind = Prog::kFullMatch;
      anchor = Prog::kAnchored;

      // If only a small amount of text and need submatch
      // information anyway and we're going to use OnePass or BitState
      // to get it, we might as well not even bother with the DFA:
      // OnePass or BitState will be fast enough.
      // On tiny texts, OnePass outruns even the DFA, and
      // it doesn't have the shared state and occasional mutex that
      // the DFA does.
      if (can_one_pass && text.size() <= 4096 &&
          (ncap > 1 || text.size() <= 8)) {
        skipped_test = true;
        break;
      }
      if (can_bit_state && text.size() <= bit_state_text_max && ncap > 1) {
        skipped_test = true;
        break;
      }
      if (!prog_->SearchDFA(subtext, text, anchor, kind,
                            &match, &dfa_failed, NULL)) {
        if (dfa_failed) {
          if (options_.log_errors())
            LOG(ERROR) << "DFA out of memory: size " << prog_->size() << ", "
                       << "bytemap range " << prog_->bytemap_range() << ", "
                       << "list count " << prog_->list_count();
          // Fall back to NFA below.
          skipped_test = true;
          break;
        }
        return false;
      }
      break;
  }

  if (!skipped_test && ncap <= 1) {
    // We know exactly where it matches.  That's enough.
    if (ncap == 1)
      submatch[0] = match;
  } else {
    StringPiece subtext1;
    if (skipped_test) {
      // DFA ran out of memory or was skipped:
      // need to search in entire original text.
      subtext1 = subtext;
    } else {
      // DFA found the exact match location:
      // let NFA run an anchored, full match search
      // to find submatch locations.
      subtext1 = match;
      anchor = Prog::kAnchored;
      kind = Prog::kFullMatch;
    }

    if (can_one_pass && anchor != Prog::kUnanchored) {
      if (!prog_->SearchOnePass(subtext1, text, anchor, kind, submatch, ncap)) {
        if (!skipped_test && options_.log_errors())
          LOG(ERROR) << "SearchOnePass inconsistency";
        return false;
      }
    } else if (can_bit_state && subtext1.size() <= bit_state_text_max) {
      if (!prog_->SearchBitState(subtext1, text, anchor,
                                 kind, submatch, ncap)) {
        if (!skipped_test && options_.log_errors())
          LOG(ERROR) << "SearchBitState inconsistency";
        return false;
      }
    } else {
      if (!prog_->SearchNFA(subtext1, text, anchor, kind, submatch, ncap)) {
        if (!skipped_test && options_.log_errors())
          LOG(ERROR) << "SearchNFA inconsistency";
        return false;
      }
    }
  }

  // Adjust overall match for required prefix that we stripped off.
  if (prefixlen > 0 && nsubmatch > 0)
    submatch[0] = StringPiece(submatch[0].data() - prefixlen,
                              submatch[0].size() + prefixlen);

  // Zero submatches that don't exist in the regexp.
  for (int i = ncap; i < nsubmatch; i++)
    submatch[i] = StringPiece();
  return true;
}